

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qstring.h
# Opt level: O2

QString * __thiscall QString::right(QString *__return_storage_ptr__,QString *this,qsizetype n)

{
  if ((ulong)n < (ulong)(this->d).size) {
    last(__return_storage_ptr__,this,n);
  }
  else {
    QArrayDataPointer<char16_t>::QArrayDataPointer(&__return_storage_ptr__->d,&this->d);
  }
  return __return_storage_ptr__;
}

Assistant:

[[nodiscard]] QString right(qsizetype n) const &
    {
        if (size_t(n) >= size_t(size()))
            return *this;
        return last(n);
    }